

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::SetNavFocusScope(ImGuiID focus_scope_id)

{
  ImVector<ImGuiFocusScopeData> *this;
  ImGuiFocusScopeData *pIVar1;
  long lVar2;
  ImGuiContext *pIVar3;
  ulong uVar4;
  ImGuiWindow *pIVar5;
  ImGuiFocusScopeData local_30;
  
  pIVar3 = GImGui;
  GImGui->NavFocusScopeId = focus_scope_id;
  this = &pIVar3->NavFocusRoute;
  ImVector<ImGuiFocusScopeData>::resize(this,0);
  if (focus_scope_id != 0) {
    if (pIVar3->CurrentFocusScopeId == focus_scope_id) {
      uVar4 = (ulong)(uint)(pIVar3->FocusScopeStack).Size;
      lVar2 = uVar4 * 8;
      while ((0 < (int)uVar4 &&
             (pIVar1 = (pIVar3->FocusScopeStack).Data,
             pIVar1[uVar4 - 1].WindowID == pIVar3->CurrentWindow->ID))) {
        ImVector<ImGuiFocusScopeData>::push_back
                  (this,(ImGuiFocusScopeData *)((long)&pIVar1[-1].ID + lVar2));
        uVar4 = uVar4 - 1;
        lVar2 = lVar2 + -8;
      }
    }
    else {
      if (pIVar3->NavWindow->NavRootFocusScopeId != focus_scope_id) {
        return;
      }
      local_30.WindowID = pIVar3->NavWindow->ID;
      local_30.ID = focus_scope_id;
      ImVector<ImGuiFocusScopeData>::push_back(this,&local_30);
    }
    pIVar5 = pIVar3->NavWindow;
    while (pIVar5 = pIVar5->ParentWindowForFocusRoute, pIVar5 != (ImGuiWindow *)0x0) {
      local_30.ID = pIVar5->NavRootFocusScopeId;
      local_30.WindowID = pIVar5->ID;
      ImVector<ImGuiFocusScopeData>::push_back(this,&local_30);
    }
  }
  return;
}

Assistant:

void ImGui::SetNavFocusScope(ImGuiID focus_scope_id)
{
    ImGuiContext& g = *GImGui;
    g.NavFocusScopeId = focus_scope_id;
    g.NavFocusRoute.resize(0); // Invalidate
    if (focus_scope_id == 0)
        return;
    IM_ASSERT(g.NavWindow != NULL);

    // Store current path (in reverse order)
    if (focus_scope_id == g.CurrentFocusScopeId)
    {
        // Top of focus stack contains local focus scopes inside current window
        for (int n = g.FocusScopeStack.Size - 1; n >= 0 && g.FocusScopeStack.Data[n].WindowID == g.CurrentWindow->ID; n--)
            g.NavFocusRoute.push_back(g.FocusScopeStack.Data[n]);
    }
    else if (focus_scope_id == g.NavWindow->NavRootFocusScopeId)
        g.NavFocusRoute.push_back({ focus_scope_id, g.NavWindow->ID });
    else
        return;

    // Then follow on manually set ParentWindowForFocusRoute field (#6798)
    for (ImGuiWindow* window = g.NavWindow->ParentWindowForFocusRoute; window != NULL; window = window->ParentWindowForFocusRoute)
        g.NavFocusRoute.push_back({ window->NavRootFocusScopeId, window->ID });
    IM_ASSERT(g.NavFocusRoute.Size < 100); // Maximum depth is technically 251 as per CalcRoutingScore(): 254 - 3
}